

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

void __thiscall GGSock::FileServer::FileServer(FileServer *this)

{
  Impl *this_00;
  pointer in_RDI;
  
  this_00 = (Impl *)operator_new(0x128);
  memset(this_00,0,0x128);
  Impl::Impl(this_00);
  std::unique_ptr<GGSock::FileServer::Impl,std::default_delete<GGSock::FileServer::Impl>>::
  unique_ptr<std::default_delete<GGSock::FileServer::Impl>,void>
            ((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )this_00,in_RDI);
  return;
}

Assistant:

FileServer::FileServer() : m_impl(new Impl()) {
}